

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O2

int qc_staticlist_get_head(QcStaticList *staticList)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  
  if (staticList == (QcStaticList *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = staticList->head;
    lVar4 = (long)iVar1;
    if (lVar4 != -99) {
      lVar3 = staticList->buff_offset;
      iVar2 = *(int *)((long)&staticList->tail + lVar4 * 8 + lVar3);
      staticList->head = iVar2;
      piVar5 = (int *)((long)&staticList->head + (long)iVar2 * 8 + lVar3);
      if ((long)iVar2 == -99) {
        piVar5 = &staticList->tail;
      }
      *piVar5 = -99;
      staticList->num = staticList->num + -1;
      *(undefined8 *)((long)&staticList->head + lVar4 * 8 + lVar3) = 0xffffff9dffffff9d;
      return iVar1;
    }
    iVar1 = -99;
  }
  return iVar1;
}

Assistant:

int qc_staticlist_get_head(QcStaticList *staticList)
{
    int head;
    _StaticCell *headCell, *secondCell;

    if(NULL == staticList)
        return -1;

    head = staticList->head;
    if(head != QC_INVALID_INT)
    {
        headCell = get_staticlist_cell(staticList, staticList->head);
        staticList->head = headCell->next;
        if(staticList->head == QC_INVALID_INT)
        {
            staticList->tail = QC_INVALID_INT;
        }
        else
        {
            secondCell = get_staticlist_cell(staticList, staticList->head);
            secondCell->previous = QC_INVALID_INT;
        }
        staticList->num --;

        headCell->previous  = QC_INVALID_INT;
        headCell->next = QC_INVALID_INT;
    }

    return head;
}